

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

bool duckdb::ApproxEqual(double ldecimal,double rdecimal)

{
  bool bVar1;
  
  bVar1 = Value::IsNan<double>(ldecimal);
  if ((bVar1) && (bVar1 = Value::IsNan<double>(rdecimal), bVar1)) {
    return true;
  }
  bVar1 = Value::DoubleIsFinite(ldecimal);
  if ((bVar1) && (bVar1 = Value::DoubleIsFinite(rdecimal), bVar1)) {
    return ABS(ldecimal - rdecimal) <= ABS(rdecimal) * 0.01 + 1e-08;
  }
  return (bool)(-(ldecimal == rdecimal) & 1);
}

Assistant:

bool ApproxEqual(double ldecimal, double rdecimal) {
	if (Value::IsNan(ldecimal) && Value::IsNan(rdecimal)) {
		return true;
	}
	if (!Value::DoubleIsFinite(ldecimal) || !Value::DoubleIsFinite(rdecimal)) {
		return ldecimal == rdecimal;
	}
	double epsilon = std::fabs(rdecimal) * 0.01 + 0.00000001;
	return std::fabs(ldecimal - rdecimal) <= epsilon;
}